

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

cmMakefileTargetGenerator * cmMakefileTargetGenerator::New(cmGeneratorTarget *tgt)

{
  TargetType TVar1;
  cmMakefileLibraryTargetGenerator *local_20;
  cmMakefileTargetGenerator *result;
  cmGeneratorTarget *tgt_local;
  
  TVar1 = cmGeneratorTarget::GetType(tgt);
  if (TVar1 == EXECUTABLE) {
    local_20 = (cmMakefileLibraryTargetGenerator *)operator_new(0x420);
    cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
              ((cmMakefileExecutableTargetGenerator *)local_20,tgt);
  }
  else if (TVar1 - STATIC_LIBRARY < 4) {
    local_20 = (cmMakefileLibraryTargetGenerator *)operator_new(0x440);
    cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator(local_20,tgt);
  }
  else {
    if (TVar1 != UTILITY) {
      return (cmMakefileTargetGenerator *)0x0;
    }
    local_20 = (cmMakefileLibraryTargetGenerator *)operator_new(0x400);
    cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
              ((cmMakefileUtilityTargetGenerator *)local_20,tgt);
  }
  return &local_20->super_cmMakefileTargetGenerator;
}

Assistant:

cmMakefileTargetGenerator* cmMakefileTargetGenerator::New(
  cmGeneratorTarget* tgt)
{
  cmMakefileTargetGenerator* result = nullptr;

  switch (tgt->GetType()) {
    case cmStateEnums::EXECUTABLE:
      result = new cmMakefileExecutableTargetGenerator(tgt);
      break;
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      result = new cmMakefileLibraryTargetGenerator(tgt);
      break;
    case cmStateEnums::UTILITY:
      result = new cmMakefileUtilityTargetGenerator(tgt);
      break;
    default:
      return result;
      // break; /* unreachable */
  }
  return result;
}